

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O2

bool __thiscall
Memory::PreReservedVirtualAllocWrapper::IsInRange
          (PreReservedVirtualAllocWrapper *this,void *address)

{
  code *pcVar1;
  bool bVar2;
  SIZE_T SVar3;
  undefined4 *puVar4;
  undefined1 local_40 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  
  if (((this->preReservedStartAddress != (void *)0x0) &&
      (bVar2 = IsInRange(this->preReservedStartAddress,address), bVar2)) &&
     (SVar3 = VirtualQuery(address,(PMEMORY_BASIC_INFORMATION)local_40,0x30), SVar3 != 0)) {
    if ((int)memBasicInfo.RegionSize != 0x1000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                         ,0x97,"(memBasicInfo.State == 0x1000)",
                         "Memory not committed? Checking for uncommitted address region?");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool
PreReservedVirtualAllocWrapper::IsInRange(void * address)
{
    if (!this->IsPreReservedRegionPresent())
    {
        return false;
    }
    bool isInRange = IsInRange(GetPreReservedStartAddress(), address);
#if DBG
    if (isInRange)
    {
        //Check if the region is in MEM_COMMIT state.
        MEMORY_BASIC_INFORMATION memBasicInfo;
        size_t bytes = VirtualQuery(address, &memBasicInfo, sizeof(memBasicInfo));
        if (bytes == 0)
        {
            return false;
        }
        AssertMsg(memBasicInfo.State == MEM_COMMIT, "Memory not committed? Checking for uncommitted address region?");
    }
#endif
    return isInRange;
}